

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O1

void __thiscall Game::PlaceFood(Game *this)

{
  bool bVar1;
  result_type x;
  result_type y;
  
  do {
    do {
      x = std::uniform_int_distribution<int>::operator()
                    (&this->random_w,&this->engine,&(this->random_w)._M_param);
      y = std::uniform_int_distribution<int>::operator()
                    (&this->random_h,&this->engine,&(this->random_h)._M_param);
      bVar1 = Snake::SnakeCell(&this->snake,x,y);
    } while (bVar1);
    bVar1 = Snake::SnakeCell(&this->snake2,x,y);
  } while (bVar1);
  (this->food).x = x;
  (this->food).y = y;
  return;
}

Assistant:

void Game::PlaceFood() {
  int x, y;
  while (true) {
    x = random_w(engine);
    y = random_h(engine);
    // Check that the location is not occupied by a snake item before placing
    // food.
    if (!snake.SnakeCell(x, y) && !snake2.SnakeCell(x,y)) {
      food.x = x;
      food.y = y;
      return;
    }
  }
}